

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void unodb::test::detail::
     do_assert_result_eq<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
               (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *db,key_type key,value_view expected,char *file,int line)

{
  bool bVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  ostream *os;
  span<const_std::byte,_18446744073709551615UL> key_00;
  span<const_std::byte,_18446744073709551615UL> key_01;
  value_view expected_00;
  AssertHelper local_248;
  Message local_240;
  ostream *local_238;
  pointer pbStack_230;
  ostream *local_220;
  pointer local_218;
  undefined1 local_210 [8];
  get_result result;
  ScopedTrace local_1d5 [8];
  ScopedTrace trace;
  ostringstream local_1b0 [8];
  ostringstream msg;
  char *file_local;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *db_local;
  value_view expected_local;
  key_type key_local;
  
  key_00._M_ptr = key._M_extent._M_extent_value;
  os = (ostream *)key._M_ptr;
  _Var2._M_extent_value = (size_t)expected._M_ptr;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  key_00._M_extent._M_extent_value = _Var2._M_extent_value;
  unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
            ((detail *)local_1b0,os,key_00);
  std::__cxx11::ostringstream::str();
  testing::ScopedTrace::ScopedTrace
            (local_1d5,file,line,
             (string *)
             &result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_engaged);
  std::__cxx11::string::~string
            ((string *)
             &result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_engaged);
  _Var2._M_extent_value = key_00._M_ptr;
  local_220 = os;
  local_218 = (pointer)key_00._M_ptr;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get((get_result *)local_210,db,key);
  bVar1 = db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::key_found((get_result *)local_210);
  if (bVar1) {
    expected_00._M_extent._M_extent_value = _Var2._M_extent_value;
    expected_00._M_ptr = (pointer)expected._M_extent._M_extent_value._M_extent_value;
    assert_value_eq<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
              ((detail *)local_210,(get_result *)expected._M_ptr,expected_00);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"db.get did not find ");
    key_01._M_extent._M_extent_value = _Var2._M_extent_value;
    key_01._M_ptr = (pointer)key_00._M_ptr;
    local_238 = os;
    pbStack_230 = (pointer)key_00._M_ptr;
    unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)&std::cerr,os,key_01);
    std::operator<<((ostream *)&std::cerr,'\n');
    db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::dump(db,(ostream *)&std::cerr);
    testing::Message::Message(&local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x80,"Failed");
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::ScopedTrace::~ScopedTrace(local_1d5);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void do_assert_result_eq(const Db &db, typename Db::key_type key,
                         unodb::value_view expected, const char *file,
                         int line) {
  std::ostringstream msg;
  unodb::detail::dump_key(msg, key);
  const testing::ScopedTrace trace(file, line, msg.str());
  const auto result = db.get(key);
  if (!Db::key_found(result)) {
    // LCOV_EXCL_START
    std::cerr << "db.get did not find ";
    unodb::detail::dump_key(std::cerr, key);
    std::cerr << '\n';
    db.dump(std::cerr);
    FAIL();
    // LCOV_EXCL_STOP
  }
  assert_value_eq<Db>(result, expected);
}